

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyRoomListView.cpp
# Opt level: O1

vector<Room,_std::allocator<Room>_> * __thiscall
EmptyRoomListView::getQueryset(EmptyRoomListView *this)

{
  _Base_ptr *pp_Var1;
  pointer pRVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  Room *pRVar8;
  DateTime *startTime;
  DateTime *endTime;
  _Rb_tree_node_base *p_Var9;
  vector<Room,_std::allocator<Room>_> *this_00;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> roomFlags;
  int local_6c;
  vector<Room,_std::allocator<Room>_> *local_68;
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  local_60;
  
  pRVar2 = (this->super_ListView<Room>).super_MultipleObjectMixin<Room>.objects.
           super__Vector_base<Room,_std::allocator<Room>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_ListView<Room>).super_MultipleObjectMixin<Room>.objects.
      super__Vector_base<Room,_std::allocator<Room>_>._M_impl.super__Vector_impl_data._M_finish !=
      pRVar2) {
    (this->super_ListView<Room>).super_MultipleObjectMixin<Room>.objects.
    super__Vector_base<Room,_std::allocator<Room>_>._M_impl.super__Vector_impl_data._M_finish =
         pRVar2;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = DateTime::operator<(&(this->params).start,&(this->params).end);
  this_00 = &(this->super_ListView<Room>).super_MultipleObjectMixin<Room>.objects;
  if (bVar3) {
    local_68 = this_00;
    if ((_Rb_tree_header *)
        Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header) {
      p_Var7 = Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_6c = Room::getRoomNumber((Room *)&p_Var7[1]._M_parent);
        pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                             *)&local_60,&local_6c);
        *pmVar6 = true;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 !=
               &Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header);
    }
    if ((_Rb_tree_header *)
        Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header) {
      p_Var7 = Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pp_Var1 = &p_Var7[1]._M_parent;
        iVar4 = Slot::getApproved((Slot *)pp_Var1);
        if (iVar4 == 1) {
          pRVar8 = Slot::getRoom((Slot *)pp_Var1);
          local_6c = Room::getRoomNumber(pRVar8);
          pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)&local_60,&local_6c);
          if (*pmVar6 == true) {
            startTime = Slot::getStartTime((Slot *)pp_Var1);
            endTime = Slot::getEndTime((Slot *)pp_Var1);
            bVar3 = clash(this,startTime,endTime);
            if (bVar3) {
              pRVar8 = Slot::getRoom((Slot *)pp_Var1);
              local_6c = Room::getRoomNumber(pRVar8);
              pmVar6 = std::
                       map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                     *)&local_60,&local_6c);
              *pmVar6 = false;
            }
          }
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 !=
               &Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header);
    }
    if ((_Rb_tree_header *)
        Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header) {
      p_Var7 = Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        iVar4 = (this->params).strength;
        pp_Var1 = &p_Var7[1]._M_parent;
        iVar5 = Room::getStrength((Room *)pp_Var1);
        if (iVar5 < iVar4) {
          local_6c = Room::getRoomNumber((Room *)pp_Var1);
          pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)&local_60,&local_6c);
          *pmVar6 = false;
        }
        if (((this->params).audio == true) && (bVar3 = Room::hasAudio((Room *)pp_Var1), !bVar3)) {
          local_6c = Room::getRoomNumber((Room *)pp_Var1);
          pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)&local_60,&local_6c);
          *pmVar6 = false;
        }
        if (((this->params).video == true) && (bVar3 = Room::hasVideo((Room *)pp_Var1), !bVar3)) {
          local_6c = Room::getRoomNumber((Room *)pp_Var1);
          pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)&local_60,&local_6c);
          *pmVar6 = false;
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 !=
               &Model<Room>::objectList._M_t._M_impl.super__Rb_tree_header);
    }
    this_00 = local_68;
    for (p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &local_60._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      if (p_Var9[1].field_0x4 == '\x01') {
        pRVar8 = Room::findByRoomNumber(p_Var9[1]._M_color);
        std::vector<Room,_std::allocator<Room>_>::push_back(this_00,pRVar8);
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&local_60);
  return this_00;
}

Assistant:

vector<Room> &EmptyRoomListView::getQueryset() {
    objects.clear();
    map<int, bool> roomFlags;
    if (params.start < params.end) {
        for (auto &i :Room::all()) {
            roomFlags[i.second.getRoomNumber()] = true;
        }

        for (auto &i : Slot::all()) {
            if (i.second.getApproved()==1 && roomFlags[i.second.getRoom().getRoomNumber()] &&
                clash(i.second.getStartTime(), i.second.getEndTime())) {
                roomFlags[i.second.getRoom().getRoomNumber()] = false;
            }
        }
        for(auto &i: Room::all()){
            if(params.strength>i.second.getStrength())
                roomFlags[i.second.getRoomNumber()]=false;
            if(params.audio && !i.second.hasAudio())
                roomFlags[i.second.getRoomNumber()] = false;
            if(params.video && !i.second.hasVideo())
                roomFlags[i.second.getRoomNumber()] = false;
        }

        for (auto &i : roomFlags) {
            if (i.second) objects.push_back(*Room::findByRoomNumber(i.first));
        }
    }
    return objects;
}